

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O0

void cpu_set_cwp_sparc64(CPUSPARCState_conflict2 *env,int new_cwp)

{
  int new_cwp_local;
  CPUSPARCState_conflict2 *env_local;
  
  if (env->cwp == env->nwindows - 1) {
    memcpy32(env->regbase,env->regbase + (env->nwindows << 4));
  }
  env->cwp = new_cwp;
  if (new_cwp == env->nwindows - 1) {
    memcpy32(env->regbase + (env->nwindows << 4),env->regbase);
  }
  env->regwptr = env->regbase + (new_cwp << 4);
  return;
}

Assistant:

void cpu_set_cwp(CPUSPARCState *env, int new_cwp)
{
    /* put the modified wrap registers at their proper location */
    if (env->cwp == env->nwindows - 1) {
        memcpy32(env->regbase, env->regbase + env->nwindows * 16);
    }
    env->cwp = new_cwp;

    /* put the wrap registers at their temporary location */
    if (new_cwp == env->nwindows - 1) {
        memcpy32(env->regbase + env->nwindows * 16, env->regbase);
    }
    env->regwptr = env->regbase + (new_cwp * 16);
}